

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool __thiscall ON_BinaryArchive::ReadComponentIndex(ON_BinaryArchive *this,ON_COMPONENT_INDEX *ci)

{
  TYPE TVar1;
  bool local_1d;
  int local_1c;
  bool rc;
  ON_COMPONENT_INDEX *pOStack_18;
  int t;
  ON_COMPONENT_INDEX *ci_local;
  ON_BinaryArchive *this_local;
  
  ci->m_type = invalid_type;
  ci->m_index = 0;
  pOStack_18 = ci;
  ci_local = (ON_COMPONENT_INDEX *)this;
  local_1d = ReadInt(this,&local_1c);
  if ((local_1d) && (local_1d = ReadInt(this,&pOStack_18->m_index), local_1d)) {
    TVar1 = ON_COMPONENT_INDEX::Type(local_1c);
    pOStack_18->m_type = TVar1;
  }
  return local_1d;
}

Assistant:

bool
ON_BinaryArchive::ReadComponentIndex(
		ON_COMPONENT_INDEX& ci
		)
{
  int t;
  ci.m_type = ON_COMPONENT_INDEX::invalid_type;
  ci.m_index = 0;
  bool rc = ReadInt( &t );
  if (rc)
  {
    rc = ReadInt( &ci.m_index );
    if (rc)
    {
      ci.m_type = ON_COMPONENT_INDEX::Type(t);
    }
    // do not add additional read - you will break old file IO
  }
  return rc;
}